

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.h
# Opt level: O2

int kputuw(uint c,kstring_t *s)

{
  char cVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  size_t __size;
  long lVar6;
  undefined8 uStack_30;
  char buf [16];
  
  if (c == 0) {
    uStack_30 = 0x30;
    iVar3 = kputc(0x30,s);
    return iVar3;
  }
  lVar6 = 0;
  for (; c != 0; c = c / 10) {
    buf[lVar6] = (byte)(c % 10) | 0x30;
    lVar6 = lVar6 + 1;
  }
  uVar4 = (ulong)((int)lVar6 + 1) + s->l;
  if (s->m <= uVar4) {
    uVar4 = uVar4 >> 1 | uVar4;
    uVar4 = uVar4 >> 2 | uVar4;
    uVar4 = uVar4 >> 4 | uVar4;
    uVar4 = uVar4 >> 8 | uVar4;
    __size = (uVar4 >> 0x10 | uVar4) + 1;
    s->m = __size;
    uStack_30 = 0x111e73;
    pcVar5 = (char *)realloc(s->s,__size);
    if (pcVar5 == (char *)0x0) goto LAB_00111ea7;
    s->s = pcVar5;
  }
  for (; 0 < lVar6; lVar6 = lVar6 + -1) {
    cVar1 = buf[lVar6 + -1];
    sVar2 = s->l;
    s->l = sVar2 + 1;
    s->s[sVar2] = cVar1;
  }
  pcVar5 = (char *)s->l;
  s->s[(long)pcVar5] = '\0';
LAB_00111ea7:
  return (int)pcVar5;
}

Assistant:

static inline int kputuw(unsigned c, kstring_t *s)
{
	char buf[16];
	int l, i;
	unsigned x;
	if (c == 0) return kputc('0', s);
	for (l = 0, x = c; x > 0; x /= 10) buf[l++] = x%10 + '0';
	if (s->l + l + 1 >= s->m) {
		char *tmp;
		s->m = s->l + l + 2;
		kroundup32(s->m);
		if ((tmp = (char*)realloc(s->s, s->m)))
			s->s = tmp;
		else
			return EOF;
	}
	for (i = l - 1; i >= 0; --i) s->s[s->l++] = buf[i];
	s->s[s->l] = 0;
	return 0;
}